

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONBuildPresets.cxx
# Opt level: O0

bool cmCMakePresetsGraphInternal::BuildPresetsHelper
               (vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>
                *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  Object<cmCMakePresetsGraph::BuildPreset> *in_RCX;
  Object<cmCMakePresetsGraph::BuildPreset> local_88;
  function<void_(const_Json::Value_*,_cmJSONState_*)> local_40;
  cmJSONState *local_20;
  cmJSONState *state_local;
  Value *value_local;
  vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>
  *out_local;
  
  local_20 = state;
  state_local = (cmJSONState *)value;
  value_local = (Value *)out;
  if (BuildPresetsHelper(std::vector<cmCMakePresetsGraph::BuildPreset,std::allocator<cmCMakePresetsGraph::BuildPreset>>&,Json::Value_const*,cmJSONState*)
      ::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&BuildPresetsHelper(std::vector<cmCMakePresetsGraph::BuildPreset,std::allocator<cmCMakePresetsGraph::BuildPreset>>&,Json::Value_const*,cmJSONState*)
                                 ::helper);
    if (iVar2 != 0) {
      std::function<void(Json::Value_const*,cmJSONState*)>::
      function<void(&)(Json::Value_const*,cmJSONState*),void>
                ((function<void(Json::Value_const*,cmJSONState*)> *)&local_40,
                 cmCMakePresetsErrors::INVALID_PRESETS);
      cmJSONHelperBuilder::Object<cmCMakePresetsGraph::BuildPreset>::Object
                (&local_88,
                 (Object<cmCMakePresetsGraph::BuildPreset> *)
                 (anonymous_namespace)::BuildPresetHelper);
      cmJSONHelperBuilder::
      Vector<cmCMakePresetsGraph::BuildPreset,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::BuildPreset>>
                (&BuildPresetsHelper::helper,(cmJSONHelperBuilder *)&local_40,
                 (ErrorGenerator *)&local_88,in_RCX);
      cmJSONHelperBuilder::Object<cmCMakePresetsGraph::BuildPreset>::~Object(&local_88);
      std::function<void_(const_Json::Value_*,_cmJSONState_*)>::~function(&local_40);
      __cxa_atexit(std::
                   function<bool_(std::vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                   ::~function,&BuildPresetsHelper::helper,&__dso_handle);
      __cxa_guard_release(&BuildPresetsHelper(std::vector<cmCMakePresetsGraph::BuildPreset,std::allocator<cmCMakePresetsGraph::BuildPreset>>&,Json::Value_const*,cmJSONState*)
                           ::helper);
    }
  }
  bVar1 = std::
          function<bool_(std::vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>_&,_const_Json::Value_*,_cmJSONState_*)>
          ::operator()(&BuildPresetsHelper::helper,
                       (vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>
                        *)value_local,(Value *)state_local,local_20);
  return bVar1;
}

Assistant:

bool BuildPresetsHelper(std::vector<BuildPreset>& out,
                        const Json::Value* value, cmJSONState* state)
{
  static auto const helper = JSONHelperBuilder::Vector<BuildPreset>(
    cmCMakePresetsErrors::INVALID_PRESETS, BuildPresetHelper);

  return helper(out, value, state);
}